

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_altsvc_free(nghttp2_extension *frame,nghttp2_mem *mem)

{
  nghttp2_ext_altsvc *altsvc;
  nghttp2_mem *mem_local;
  nghttp2_extension *frame_local;
  
  if ((undefined8 *)frame->payload != (undefined8 *)0x0) {
    nghttp2_mem_free(mem,*frame->payload);
  }
  return;
}

Assistant:

void nghttp2_frame_altsvc_free(nghttp2_extension *frame, nghttp2_mem *mem) {
  nghttp2_ext_altsvc *altsvc;

  altsvc = frame->payload;
  if (altsvc == NULL) {
    return;
  }
  /* We use the same buffer for altsvc->origin and
     altsvc->field_value. */
  nghttp2_mem_free(mem, altsvc->origin);
}